

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<4,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  ulong uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCIntersectArguments *pRVar5;
  RTCRayQueryContext *pRVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 (*pauVar22) [16];
  byte bVar23;
  int iVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined4 uVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  float fVar82;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_11a1;
  ulong local_11a0;
  ulong local_1198;
  long local_1190;
  float local_1188;
  int local_1184;
  RayHit *local_1180;
  RayQueryContext *local_1178;
  ulong local_1170;
  undefined1 (*local_1168) [16];
  ulong local_1160;
  ulong local_1158;
  ulong local_1150;
  ulong local_1148;
  ulong local_1140;
  long local_1138;
  long local_1130;
  RTCFilterFunctionNArguments local_1128;
  float local_10f8;
  float local_10f4;
  float local_10f0;
  undefined4 local_10ec;
  undefined4 local_10e8;
  undefined4 local_10e4;
  uint local_10e0;
  uint local_10dc;
  uint local_10d8;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 *local_1038;
  byte local_1030;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  float local_fd8 [4];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      aVar1 = (ray->super_RayK<1>).dir.field_0;
      auVar41 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx512vl((undefined1  [16])aVar1,auVar37);
      auVar38._8_4_ = 0x219392ef;
      auVar38._0_8_ = 0x219392ef219392ef;
      auVar38._12_4_ = 0x219392ef;
      uVar28 = vcmpps_avx512vl(auVar37,auVar38,1);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar92 = ZEXT1664(auVar37);
      auVar37 = vdivps_avx512vl(auVar37,(undefined1  [16])aVar1);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar7 = (bool)((byte)uVar28 & 1);
      auVar52._0_4_ = (uint)bVar7 * auVar38._0_4_ | (uint)!bVar7 * auVar37._0_4_;
      bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
      auVar52._4_4_ = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * auVar37._4_4_;
      bVar7 = (bool)((byte)(uVar28 >> 2) & 1);
      auVar52._8_4_ = (uint)bVar7 * auVar38._8_4_ | (uint)!bVar7 * auVar37._8_4_;
      bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
      auVar52._12_4_ = (uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * auVar37._12_4_;
      auVar39._8_4_ = 0x3f7ffffa;
      auVar39._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar39._12_4_ = 0x3f7ffffa;
      auVar39 = vmulps_avx512vl(auVar52,auVar39);
      auVar40._8_4_ = 0x3f800003;
      auVar40._0_8_ = 0x3f8000033f800003;
      auVar40._12_4_ = 0x3f800003;
      auVar40 = vmulps_avx512vl(auVar52,auVar40);
      local_1088 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
      auVar93 = ZEXT1664(local_1088);
      pauVar33 = (undefined1 (*) [16])local_f68;
      local_1098 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
      auVar94 = ZEXT1664(local_1098);
      local_10a8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
      auVar95 = ZEXT1664(local_10a8);
      local_10b8 = vbroadcastss_avx512vl(auVar39);
      auVar96 = ZEXT1664(local_10b8);
      auVar37 = vmovshdup_avx(auVar39);
      local_10c8 = vshufps_avx512vl(auVar39,auVar39,0x55);
      auVar97 = ZEXT1664(local_10c8);
      auVar38 = vshufpd_avx(auVar39,auVar39,1);
      local_f88 = vshufps_avx(auVar39,auVar39,0xaa);
      auVar81 = ZEXT1664(local_f88);
      local_f98 = auVar40._0_4_;
      local_fa8 = vshufps_avx(auVar40,auVar40,0x55);
      auVar88 = ZEXT1664(local_fa8);
      local_fb8 = vshufps_avx(auVar40,auVar40,0xaa);
      auVar89 = ZEXT1664(local_fb8);
      uVar31 = (ulong)(auVar39._0_4_ < 0.0) << 4;
      uVar32 = (ulong)(auVar37._0_4_ < 0.0) << 4 | 0x20;
      local_1148 = (ulong)(auVar38._0_4_ < 0.0) << 4 | 0x40;
      uVar70 = auVar41._0_4_;
      local_fc8._4_4_ = uVar70;
      local_fc8._0_4_ = uVar70;
      local_fc8._8_4_ = uVar70;
      local_fc8._12_4_ = uVar70;
      auVar90 = ZEXT1664(local_fc8);
      uVar70 = auVar42._0_4_;
      auVar69 = ZEXT1664(CONCAT412(uVar70,CONCAT48(uVar70,CONCAT44(uVar70,uVar70))));
      local_1178 = context;
      local_1180 = ray;
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      local_1150 = uVar31 ^ 0x10;
      local_1158 = uVar32 ^ 0x10;
      local_1160 = local_1148 ^ 0x10;
      uVar28 = local_1148;
      uVar26 = local_1148 ^ 0x10;
      uVar34 = uVar31 ^ 0x10;
      uVar35 = uVar32 ^ 0x10;
      fVar82 = local_f98;
      fVar85 = local_f98;
      fVar86 = local_f98;
      fVar87 = local_f98;
      local_11a0 = uVar32;
      local_1198 = uVar31;
      do {
        do {
          do {
            if (pauVar33 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar22 = pauVar33 + -1;
            pauVar33 = pauVar33 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar22 + 8));
          uVar30 = *(ulong *)*pauVar33;
          do {
            if ((uVar30 & 8) == 0) {
              uVar25 = uVar30 & 0xfffffffffffffff0;
              uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
              auVar53._4_4_ = uVar70;
              auVar53._0_4_ = uVar70;
              auVar53._8_4_ = uVar70;
              auVar53._12_4_ = uVar70;
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar31),auVar53,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + uVar31));
              auVar41 = vsubps_avx512vl(auVar41,auVar93._0_16_);
              auVar41 = vmulps_avx512vl(auVar96._0_16_,auVar41);
              auVar41 = vmaxps_avx(auVar90._0_16_,auVar41);
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar32),auVar53,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + uVar32));
              auVar42 = vsubps_avx512vl(auVar42,auVar94._0_16_);
              auVar37 = vmulps_avx512vl(auVar97._0_16_,auVar42);
              auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar28),auVar53,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + uVar28));
              auVar42 = vsubps_avx512vl(auVar42,auVar95._0_16_);
              auVar54._0_4_ = auVar81._0_4_ * auVar42._0_4_;
              auVar54._4_4_ = auVar81._4_4_ * auVar42._4_4_;
              auVar54._8_4_ = auVar81._8_4_ * auVar42._8_4_;
              auVar54._12_4_ = auVar81._12_4_ * auVar42._12_4_;
              auVar42 = vmaxps_avx(auVar37,auVar54);
              local_1068 = vmaxps_avx(auVar41,auVar42);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar34),auVar53,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + uVar34));
              auVar41 = vsubps_avx512vl(auVar41,auVar93._0_16_);
              auVar42._0_4_ = fVar82 * auVar41._0_4_;
              auVar42._4_4_ = fVar85 * auVar41._4_4_;
              auVar42._8_4_ = fVar86 * auVar41._8_4_;
              auVar42._12_4_ = fVar87 * auVar41._12_4_;
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar35),auVar53,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + uVar35));
              auVar41 = vsubps_avx512vl(auVar41,auVar94._0_16_);
              auVar48._0_4_ = auVar88._0_4_ * auVar41._0_4_;
              auVar48._4_4_ = auVar88._4_4_ * auVar41._4_4_;
              auVar48._8_4_ = auVar88._8_4_ * auVar41._8_4_;
              auVar48._12_4_ = auVar88._12_4_ * auVar41._12_4_;
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar26),auVar53,
                                        *(undefined1 (*) [16])(uVar25 + 0x20 + uVar26));
              auVar41 = vsubps_avx512vl(auVar41,auVar95._0_16_);
              auVar49._0_4_ = auVar89._0_4_ * auVar41._0_4_;
              auVar49._4_4_ = auVar89._4_4_ * auVar41._4_4_;
              auVar49._8_4_ = auVar89._8_4_ * auVar41._8_4_;
              auVar49._12_4_ = auVar89._12_4_ * auVar41._12_4_;
              auVar41 = vminps_avx(auVar48,auVar49);
              auVar42 = vminps_avx(auVar69._0_16_,auVar42);
              auVar41 = vminps_avx(auVar42,auVar41);
              uVar9 = vcmpps_avx512vl(local_1068,auVar41,2);
              bVar23 = (byte)uVar9;
              if (((uint)uVar30 & 7) == 6) {
                uVar9 = vcmpps_avx512vl(auVar53,*(undefined1 (*) [16])(uVar25 + 0xf0),1);
                uVar10 = vcmpps_avx512vl(auVar53,*(undefined1 (*) [16])(uVar25 + 0xe0),0xd);
                bVar23 = (byte)uVar9 & (byte)uVar10 & bVar23;
              }
              unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),(uint)bVar23);
            }
            if ((uVar30 & 8) == 0) {
              if (unaff_RBP == 0) {
                iVar24 = 4;
              }
              else {
                uVar25 = uVar30 & 0xfffffffffffffff0;
                lVar13 = 0;
                for (uVar30 = unaff_RBP; (uVar30 & 1) == 0;
                    uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                  lVar13 = lVar13 + 1;
                }
                iVar24 = 0;
                uVar29 = unaff_RBP - 1 & unaff_RBP;
                uVar30 = *(ulong *)(uVar25 + lVar13 * 8);
                if (uVar29 != 0) {
                  uVar36 = *(uint *)(local_1068 + lVar13 * 4);
                  lVar13 = 0;
                  for (uVar31 = uVar29; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000
                      ) {
                    lVar13 = lVar13 + 1;
                  }
                  uVar29 = uVar29 - 1 & uVar29;
                  uVar2 = *(ulong *)(uVar25 + lVar13 * 8);
                  uVar27 = *(uint *)(local_1068 + lVar13 * 4);
                  uVar31 = local_1198;
                  uVar32 = local_11a0;
                  if (uVar29 == 0) {
                    if (uVar36 < uVar27) {
                      *(ulong *)*pauVar33 = uVar2;
                      *(uint *)((long)*pauVar33 + 8) = uVar27;
                      pauVar33 = pauVar33 + 1;
                    }
                    else {
                      *(ulong *)*pauVar33 = uVar30;
                      *(uint *)((long)*pauVar33 + 8) = uVar36;
                      uVar30 = uVar2;
                      pauVar33 = pauVar33 + 1;
                    }
                  }
                  else {
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = uVar30;
                    auVar41 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar36));
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = uVar2;
                    auVar42 = vpunpcklqdq_avx(auVar50,ZEXT416(uVar27));
                    lVar13 = 0;
                    for (uVar30 = uVar29; (uVar30 & 1) == 0;
                        uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                      lVar13 = lVar13 + 1;
                    }
                    uVar29 = uVar29 - 1 & uVar29;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = *(ulong *)(uVar25 + lVar13 * 8);
                    auVar40 = vpunpcklqdq_avx(auVar51,ZEXT416(*(uint *)(local_1068 + lVar13 * 4)));
                    auVar37 = vpshufd_avx(auVar41,0xaa);
                    auVar38 = vpshufd_avx(auVar42,0xaa);
                    auVar39 = vpshufd_avx(auVar40,0xaa);
                    if (uVar29 == 0) {
                      uVar30 = vpcmpgtd_avx512vl(auVar38,auVar37);
                      uVar30 = uVar30 & 0xf;
                      auVar38 = vpblendmd_avx512vl(auVar42,auVar41);
                      bVar7 = (bool)((byte)uVar30 & 1);
                      auVar43._0_4_ = (uint)bVar7 * auVar38._0_4_ | (uint)!bVar7 * auVar37._0_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 1) & 1);
                      auVar43._4_4_ = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * auVar37._4_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 2) & 1);
                      auVar43._8_4_ = (uint)bVar7 * auVar38._8_4_ | (uint)!bVar7 * auVar37._8_4_;
                      bVar7 = SUB81(uVar30 >> 3,0);
                      auVar43._12_4_ = (uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * auVar37._12_4_;
                      auVar42 = vmovdqa32_avx512vl(auVar42);
                      bVar7 = (bool)((byte)uVar30 & 1);
                      auVar44._0_4_ = (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar41._0_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 1) & 1);
                      auVar44._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar41._4_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 2) & 1);
                      auVar44._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar41._8_4_;
                      bVar7 = SUB81(uVar30 >> 3,0);
                      auVar44._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar41._12_4_;
                      auVar41 = vpshufd_avx(auVar43,0xaa);
                      uVar25 = vpcmpgtd_avx512vl(auVar39,auVar41);
                      uVar25 = uVar25 & 0xf;
                      auVar42 = vpblendmd_avx512vl(auVar40,auVar43);
                      bVar7 = (bool)((byte)uVar25 & 1);
                      bVar8 = (bool)((byte)(uVar25 >> 1) & 1);
                      uVar30 = CONCAT44((uint)bVar8 * auVar42._4_4_ | (uint)!bVar8 * auVar41._4_4_,
                                        (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar41._0_4_);
                      auVar41 = vmovdqa32_avx512vl(auVar40);
                      bVar7 = (bool)((byte)uVar25 & 1);
                      auVar45._0_4_ = (uint)bVar7 * auVar41._0_4_ | !bVar7 * auVar43._0_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar45._4_4_ = (uint)bVar7 * auVar41._4_4_ | !bVar7 * auVar43._4_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar45._8_4_ = (uint)bVar7 * auVar41._8_4_ | !bVar7 * auVar43._8_4_;
                      bVar7 = SUB81(uVar25 >> 3,0);
                      auVar45._12_4_ = (uint)bVar7 * auVar41._12_4_ | !bVar7 * auVar43._12_4_;
                      auVar41 = vpshufd_avx(auVar45,0xaa);
                      auVar42 = vpshufd_avx(auVar44,0xaa);
                      uVar25 = vpcmpgtd_avx512vl(auVar41,auVar42);
                      uVar25 = uVar25 & 0xf;
                      auVar42 = vpblendmd_avx512vl(auVar45,auVar44);
                      bVar7 = (bool)((byte)uVar25 & 1);
                      auVar46._0_4_ = (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar41._0_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar46._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar41._4_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar46._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar41._8_4_;
                      bVar7 = SUB81(uVar25 >> 3,0);
                      auVar46._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar41._12_4_;
                      auVar41 = vmovdqa32_avx512vl(auVar45);
                      bVar7 = (bool)((byte)uVar25 & 1);
                      auVar47._0_4_ = (uint)bVar7 * auVar41._0_4_ | !bVar7 * auVar44._0_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar47._4_4_ = (uint)bVar7 * auVar41._4_4_ | !bVar7 * auVar44._4_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar47._8_4_ = (uint)bVar7 * auVar41._8_4_ | !bVar7 * auVar44._8_4_;
                      bVar7 = SUB81(uVar25 >> 3,0);
                      auVar47._12_4_ = (uint)bVar7 * auVar41._12_4_ | !bVar7 * auVar44._12_4_;
                      *pauVar33 = auVar47;
                      pauVar33[1] = auVar46;
                      pauVar33 = pauVar33 + 2;
                    }
                    else {
                      lVar13 = 0;
                      for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                        lVar13 = lVar13 + 1;
                      }
                      uVar36 = *(uint *)(local_1068 + lVar13 * 4);
                      auVar76._8_8_ = 0;
                      auVar76._0_8_ = *(ulong *)(uVar25 + lVar13 * 8);
                      auVar52 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar36));
                      uVar30 = vpcmpgtd_avx512vl(auVar38,auVar37);
                      uVar30 = uVar30 & 0xf;
                      auVar38 = vpblendmd_avx512vl(auVar42,auVar41);
                      bVar7 = (bool)((byte)uVar30 & 1);
                      auVar55._0_4_ = (uint)bVar7 * auVar38._0_4_ | (uint)!bVar7 * auVar37._0_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 1) & 1);
                      auVar55._4_4_ = (uint)bVar7 * auVar38._4_4_ | (uint)!bVar7 * auVar37._4_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 2) & 1);
                      auVar55._8_4_ = (uint)bVar7 * auVar38._8_4_ | (uint)!bVar7 * auVar37._8_4_;
                      bVar7 = SUB81(uVar30 >> 3,0);
                      auVar55._12_4_ = (uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * auVar37._12_4_;
                      auVar42 = vmovdqa32_avx512vl(auVar42);
                      bVar7 = (bool)((byte)uVar30 & 1);
                      auVar56._0_4_ = (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar41._0_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 1) & 1);
                      auVar56._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar41._4_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 2) & 1);
                      auVar56._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar41._8_4_;
                      bVar7 = SUB81(uVar30 >> 3,0);
                      auVar56._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar41._12_4_;
                      auVar71._4_4_ = uVar36;
                      auVar71._0_4_ = uVar36;
                      auVar71._8_4_ = uVar36;
                      auVar71._12_4_ = uVar36;
                      uVar30 = vpcmpgtd_avx512vl(auVar71,auVar39);
                      uVar30 = uVar30 & 0xf;
                      auVar41 = vpblendmd_avx512vl(auVar52,auVar40);
                      bVar7 = (bool)((byte)uVar30 & 1);
                      auVar57._0_4_ = (uint)bVar7 * auVar41._0_4_ | !bVar7 * uVar36;
                      bVar7 = (bool)((byte)(uVar30 >> 1) & 1);
                      auVar57._4_4_ = (uint)bVar7 * auVar41._4_4_ | !bVar7 * uVar36;
                      bVar7 = (bool)((byte)(uVar30 >> 2) & 1);
                      auVar57._8_4_ = (uint)bVar7 * auVar41._8_4_ | !bVar7 * uVar36;
                      bVar7 = SUB81(uVar30 >> 3,0);
                      auVar57._12_4_ = (uint)bVar7 * auVar41._12_4_ | !bVar7 * uVar36;
                      auVar41 = vmovdqa32_avx512vl(auVar52);
                      bVar7 = (bool)((byte)uVar30 & 1);
                      auVar58._0_4_ = (uint)bVar7 * auVar41._0_4_ | (uint)!bVar7 * auVar40._0_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 1) & 1);
                      auVar58._4_4_ = (uint)bVar7 * auVar41._4_4_ | (uint)!bVar7 * auVar40._4_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 2) & 1);
                      auVar58._8_4_ = (uint)bVar7 * auVar41._8_4_ | (uint)!bVar7 * auVar40._8_4_;
                      bVar7 = SUB81(uVar30 >> 3,0);
                      auVar58._12_4_ = (uint)bVar7 * auVar41._12_4_ | (uint)!bVar7 * auVar40._12_4_;
                      auVar41 = vpshufd_avx(auVar58,0xaa);
                      auVar42 = vpshufd_avx(auVar56,0xaa);
                      uVar30 = vpcmpgtd_avx512vl(auVar41,auVar42);
                      uVar30 = uVar30 & 0xf;
                      auVar42 = vpblendmd_avx512vl(auVar58,auVar56);
                      bVar7 = (bool)((byte)uVar30 & 1);
                      auVar59._0_4_ = (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar41._0_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 1) & 1);
                      auVar59._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar41._4_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 2) & 1);
                      auVar59._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar41._8_4_;
                      bVar7 = SUB81(uVar30 >> 3,0);
                      auVar59._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar41._12_4_;
                      auVar41 = vmovdqa32_avx512vl(auVar58);
                      bVar7 = (bool)((byte)uVar30 & 1);
                      auVar60._0_4_ = (uint)bVar7 * auVar41._0_4_ | !bVar7 * auVar56._0_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 1) & 1);
                      auVar60._4_4_ = (uint)bVar7 * auVar41._4_4_ | !bVar7 * auVar56._4_4_;
                      bVar7 = (bool)((byte)(uVar30 >> 2) & 1);
                      auVar60._8_4_ = (uint)bVar7 * auVar41._8_4_ | !bVar7 * auVar56._8_4_;
                      bVar7 = SUB81(uVar30 >> 3,0);
                      auVar60._12_4_ = (uint)bVar7 * auVar41._12_4_ | !bVar7 * auVar56._12_4_;
                      auVar41 = vpshufd_avx(auVar57,0xaa);
                      auVar42 = vpshufd_avx(auVar55,0xaa);
                      uVar25 = vpcmpgtd_avx512vl(auVar41,auVar42);
                      uVar25 = uVar25 & 0xf;
                      auVar42 = vpblendmd_avx512vl(auVar57,auVar55);
                      bVar7 = (bool)((byte)uVar25 & 1);
                      bVar8 = (bool)((byte)(uVar25 >> 1) & 1);
                      uVar30 = CONCAT44((uint)bVar8 * auVar42._4_4_ | (uint)!bVar8 * auVar41._4_4_,
                                        (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar41._0_4_);
                      auVar41 = vmovdqa32_avx512vl(auVar57);
                      bVar7 = (bool)((byte)uVar25 & 1);
                      auVar61._0_4_ = (uint)bVar7 * auVar41._0_4_ | !bVar7 * auVar55._0_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar61._4_4_ = (uint)bVar7 * auVar41._4_4_ | !bVar7 * auVar55._4_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar61._8_4_ = (uint)bVar7 * auVar41._8_4_ | !bVar7 * auVar55._8_4_;
                      bVar7 = SUB81(uVar25 >> 3,0);
                      auVar61._12_4_ = (uint)bVar7 * auVar41._12_4_ | !bVar7 * auVar55._12_4_;
                      auVar41 = vpshufd_avx(auVar61,0xaa);
                      auVar42 = vpshufd_avx(auVar59,0xaa);
                      uVar25 = vpcmpgtd_avx512vl(auVar42,auVar41);
                      uVar25 = uVar25 & 0xf;
                      auVar42 = vpblendmd_avx512vl(auVar59,auVar61);
                      bVar7 = (bool)((byte)uVar25 & 1);
                      auVar62._0_4_ = (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar41._0_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar62._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar41._4_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar62._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar41._8_4_;
                      bVar7 = SUB81(uVar25 >> 3,0);
                      auVar62._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar41._12_4_;
                      auVar41 = vmovdqa32_avx512vl(auVar59);
                      bVar7 = (bool)((byte)uVar25 & 1);
                      auVar63._0_4_ = (uint)bVar7 * auVar41._0_4_ | !bVar7 * auVar61._0_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar63._4_4_ = (uint)bVar7 * auVar41._4_4_ | !bVar7 * auVar61._4_4_;
                      bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar63._8_4_ = (uint)bVar7 * auVar41._8_4_ | !bVar7 * auVar61._8_4_;
                      bVar7 = SUB81(uVar25 >> 3,0);
                      auVar63._12_4_ = (uint)bVar7 * auVar41._12_4_ | !bVar7 * auVar61._12_4_;
                      *pauVar33 = auVar60;
                      pauVar33[1] = auVar63;
                      pauVar33[2] = auVar62;
                      pauVar33 = pauVar33 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar24 = 6;
            }
          } while (iVar24 == 0);
        } while (iVar24 != 6);
        local_1140 = unaff_RBP;
        local_1138 = (ulong)((uint)uVar30 & 0xf) - 8;
        if (local_1138 != 0) {
          uVar30 = uVar30 & 0xfffffffffffffff0;
          local_1130 = 0;
          do {
            local_1190 = local_1130 * 0x140;
            uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar65._4_4_ = uVar70;
            auVar65._0_4_ = uVar70;
            auVar65._8_4_ = uVar70;
            auVar65._12_4_ = uVar70;
            auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x90 + local_1190),auVar65,
                                      *(undefined1 (*) [16])(uVar30 + local_1190));
            auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xa0 + local_1190),auVar65,
                                      *(undefined1 (*) [16])(uVar30 + 0x10 + local_1190));
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xb0 + local_1190),auVar65,
                                      *(undefined1 (*) [16])(uVar30 + 0x20 + local_1190));
            auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xc0 + local_1190),auVar65,
                                      *(undefined1 (*) [16])(uVar30 + 0x30 + local_1190));
            auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xd0 + local_1190),auVar65,
                                      *(undefined1 (*) [16])(uVar30 + 0x40 + local_1190));
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xe0 + local_1190),auVar65,
                                      *(undefined1 (*) [16])(uVar30 + 0x50 + local_1190));
            auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xf0 + local_1190),auVar65,
                                      *(undefined1 (*) [16])(uVar30 + 0x60 + local_1190));
            auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x100 + local_1190),auVar65,
                                      *(undefined1 (*) [16])(uVar30 + 0x70 + local_1190));
            auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x110 + local_1190),auVar65,
                                      *(undefined1 (*) [16])(uVar30 + 0x80 + local_1190));
            uVar70 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar66._4_4_ = uVar70;
            auVar66._0_4_ = uVar70;
            auVar66._8_4_ = uVar70;
            auVar66._12_4_ = uVar70;
            auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar70 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar74._4_4_ = uVar70;
            auVar74._0_4_ = uVar70;
            auVar74._8_4_ = uVar70;
            auVar74._12_4_ = uVar70;
            uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar77._4_4_ = uVar70;
            auVar77._0_4_ = uVar70;
            auVar77._8_4_ = uVar70;
            auVar77._12_4_ = uVar70;
            local_1038 = &local_11a1;
            fVar82 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar83._4_4_ = fVar82;
            auVar83._0_4_ = fVar82;
            auVar83._8_4_ = fVar82;
            auVar83._12_4_ = fVar82;
            auVar41 = vsubps_avx(auVar41,auVar66);
            auVar50 = vsubps_avx512vl(auVar42,auVar48);
            auVar51 = vsubps_avx512vl(auVar37,auVar49);
            auVar38 = vsubps_avx512vl(auVar38,auVar66);
            auVar39 = vsubps_avx512vl(auVar39,auVar48);
            auVar40 = vsubps_avx512vl(auVar40,auVar49);
            auVar52 = vsubps_avx512vl(auVar52,auVar66);
            auVar53 = vsubps_avx512vl(auVar53,auVar48);
            auVar54 = vsubps_avx512vl(auVar54,auVar49);
            auVar48 = vsubps_avx512vl(auVar52,auVar41);
            auVar42 = vsubps_avx(auVar53,auVar50);
            auVar49 = vsubps_avx512vl(auVar54,auVar51);
            auVar55 = vsubps_avx512vl(auVar41,auVar38);
            auVar56 = vsubps_avx512vl(auVar50,auVar39);
            auVar57 = vsubps_avx512vl(auVar51,auVar40);
            auVar58 = vsubps_avx512vl(auVar38,auVar52);
            auVar59 = vsubps_avx512vl(auVar39,auVar53);
            auVar60 = vsubps_avx512vl(auVar40,auVar54);
            auVar37 = vaddps_avx512vl(auVar52,auVar41);
            auVar79._0_4_ = auVar53._0_4_ + auVar50._0_4_;
            auVar79._4_4_ = auVar53._4_4_ + auVar50._4_4_;
            auVar79._8_4_ = auVar53._8_4_ + auVar50._8_4_;
            auVar79._12_4_ = auVar53._12_4_ + auVar50._12_4_;
            auVar61 = vaddps_avx512vl(auVar54,auVar51);
            auVar62 = vmulps_avx512vl(auVar79,auVar49);
            auVar62 = vfmsub231ps_avx512vl(auVar62,auVar42,auVar61);
            auVar61 = vmulps_avx512vl(auVar61,auVar48);
            auVar61 = vfmsub231ps_avx512vl(auVar61,auVar49,auVar37);
            auVar72._0_4_ = auVar42._0_4_ * auVar37._0_4_;
            auVar72._4_4_ = auVar42._4_4_ * auVar37._4_4_;
            auVar72._8_4_ = auVar42._8_4_ * auVar37._8_4_;
            auVar72._12_4_ = auVar42._12_4_ * auVar37._12_4_;
            auVar37 = vfmsub231ps_fma(auVar72,auVar48,auVar79);
            auVar73._0_4_ = fVar82 * auVar37._0_4_;
            auVar73._4_4_ = fVar82 * auVar37._4_4_;
            auVar73._8_4_ = fVar82 * auVar37._8_4_;
            auVar73._12_4_ = fVar82 * auVar37._12_4_;
            auVar37 = vfmadd231ps_avx512vl(auVar73,auVar77,auVar61);
            local_1068 = vfmadd231ps_avx512vl(auVar37,auVar74,auVar62);
            auVar37 = vaddps_avx512vl(auVar41,auVar38);
            auVar61 = vaddps_avx512vl(auVar50,auVar39);
            auVar62 = vaddps_avx512vl(auVar51,auVar40);
            auVar63 = vmulps_avx512vl(auVar61,auVar57);
            auVar63 = vfmsub231ps_avx512vl(auVar63,auVar56,auVar62);
            auVar62 = vmulps_avx512vl(auVar62,auVar55);
            auVar62 = vfmsub231ps_avx512vl(auVar62,auVar57,auVar37);
            auVar37 = vmulps_avx512vl(auVar37,auVar56);
            auVar37 = vfmsub231ps_avx512vl(auVar37,auVar55,auVar61);
            auVar80._0_4_ = fVar82 * auVar37._0_4_;
            auVar80._4_4_ = fVar82 * auVar37._4_4_;
            auVar80._8_4_ = fVar82 * auVar37._8_4_;
            auVar80._12_4_ = fVar82 * auVar37._12_4_;
            auVar37 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar62);
            local_1058 = vfmadd231ps_avx512vl(auVar37,auVar74,auVar63);
            auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar69 = ZEXT1664(auVar37);
            auVar38 = vaddps_avx512vl(auVar38,auVar52);
            auVar39 = vaddps_avx512vl(auVar39,auVar53);
            auVar40 = vaddps_avx512vl(auVar40,auVar54);
            auVar52 = vmulps_avx512vl(auVar39,auVar60);
            auVar52 = vfmsub231ps_avx512vl(auVar52,auVar59,auVar40);
            auVar40 = vmulps_avx512vl(auVar40,auVar58);
            auVar40 = vfmsub231ps_avx512vl(auVar40,auVar60,auVar38);
            auVar38 = vmulps_avx512vl(auVar38,auVar59);
            auVar38 = vfmsub231ps_avx512vl(auVar38,auVar58,auVar39);
            auVar38 = vmulps_avx512vl(auVar83,auVar38);
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar77,auVar40);
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar74,auVar52);
            auVar91._0_4_ = local_1058._0_4_ + local_1068._0_4_;
            auVar91._4_4_ = local_1058._4_4_ + local_1068._4_4_;
            auVar91._8_4_ = local_1058._8_4_ + local_1068._8_4_;
            auVar91._12_4_ = local_1058._12_4_ + local_1068._12_4_;
            local_1048 = vaddps_avx512vl(auVar38,auVar91);
            auVar14._8_4_ = 0x7fffffff;
            auVar14._0_8_ = 0x7fffffff7fffffff;
            auVar14._12_4_ = 0x7fffffff;
            auVar39 = vandps_avx512vl(local_1048,auVar14);
            auVar15._8_4_ = 0x34000000;
            auVar15._0_8_ = 0x3400000034000000;
            auVar15._12_4_ = 0x34000000;
            auVar40 = vmulps_avx512vl(auVar39,auVar15);
            auVar52 = vminps_avx512vl(local_1068,local_1058);
            auVar52 = vminps_avx512vl(auVar52,auVar38);
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar53 = vxorps_avx512vl(auVar40,auVar16);
            uVar9 = vcmpps_avx512vl(auVar52,auVar53,5);
            auVar52 = vmaxps_avx512vl(local_1068,local_1058);
            auVar38 = vmaxps_avx512vl(auVar52,auVar38);
            uVar10 = vcmpps_avx512vl(auVar38,auVar40,2);
            local_1030 = ((byte)uVar9 | (byte)uVar10) & 0xf;
            if (local_1030 != 0) {
              auVar38 = vmulps_avx512vl(auVar49,auVar56);
              auVar40 = vmulps_avx512vl(auVar48,auVar57);
              auVar52 = vmulps_avx512vl(auVar42,auVar55);
              auVar53 = vmulps_avx512vl(auVar57,auVar59);
              auVar54 = vmulps_avx512vl(auVar55,auVar60);
              auVar61 = vmulps_avx512vl(auVar56,auVar58);
              auVar42 = vfmsub213ps_avx512vl(auVar42,auVar57,auVar38);
              auVar49 = vfmsub213ps_avx512vl(auVar49,auVar55,auVar40);
              auVar48 = vfmsub213ps_avx512vl(auVar48,auVar56,auVar52);
              auVar56 = vfmsub213ps_avx512vl(auVar60,auVar56,auVar53);
              auVar57 = vfmsub213ps_avx512vl(auVar58,auVar57,auVar54);
              auVar55 = vfmsub213ps_avx512vl(auVar59,auVar55,auVar61);
              auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar38 = vandps_avx512vl(auVar38,auVar58);
              auVar53 = vandps_avx512vl(auVar53,auVar58);
              uVar28 = vcmpps_avx512vl(auVar38,auVar53,1);
              auVar38 = vandps_avx512vl(auVar40,auVar58);
              auVar40 = vandps_avx512vl(auVar54,auVar58);
              uVar26 = vcmpps_avx512vl(auVar38,auVar40,1);
              auVar38 = vandps_avx512vl(auVar52,auVar58);
              auVar40 = vandps_avx512vl(auVar61,auVar58);
              uVar34 = vcmpps_avx512vl(auVar38,auVar40,1);
              bVar7 = (bool)((byte)uVar28 & 1);
              local_ff8._0_4_ = (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar56._0_4_;
              bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
              local_ff8._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar56._4_4_;
              bVar7 = (bool)((byte)(uVar28 >> 2) & 1);
              local_ff8._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar56._8_4_;
              bVar7 = (bool)((byte)(uVar28 >> 3) & 1);
              local_ff8._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar56._12_4_;
              bVar7 = (bool)((byte)uVar26 & 1);
              local_fe8._0_4_ = (uint)bVar7 * auVar49._0_4_ | (uint)!bVar7 * auVar57._0_4_;
              bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
              local_fe8._4_4_ = (uint)bVar7 * auVar49._4_4_ | (uint)!bVar7 * auVar57._4_4_;
              bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
              local_fe8._8_4_ = (uint)bVar7 * auVar49._8_4_ | (uint)!bVar7 * auVar57._8_4_;
              bVar7 = (bool)((byte)(uVar26 >> 3) & 1);
              local_fe8._12_4_ = (uint)bVar7 * auVar49._12_4_ | (uint)!bVar7 * auVar57._12_4_;
              bVar7 = (bool)((byte)uVar34 & 1);
              local_fd8[0] = (float)((uint)bVar7 * auVar48._0_4_ | (uint)!bVar7 * auVar55._0_4_);
              bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
              local_fd8[1] = (float)((uint)bVar7 * auVar48._4_4_ | (uint)!bVar7 * auVar55._4_4_);
              bVar7 = (bool)((byte)(uVar34 >> 2) & 1);
              local_fd8[2] = (float)((uint)bVar7 * auVar48._8_4_ | (uint)!bVar7 * auVar55._8_4_);
              bVar7 = (bool)((byte)(uVar34 >> 3) & 1);
              local_fd8[3] = (float)((uint)bVar7 * auVar48._12_4_ | (uint)!bVar7 * auVar55._12_4_);
              auVar84._0_4_ = fVar82 * local_fd8[0];
              auVar84._4_4_ = fVar82 * local_fd8[1];
              auVar84._8_4_ = fVar82 * local_fd8[2];
              auVar84._12_4_ = fVar82 * local_fd8[3];
              auVar42 = vfmadd213ps_fma(auVar77,local_fe8,auVar84);
              auVar42 = vfmadd213ps_fma(auVar74,local_ff8,auVar42);
              auVar75._0_4_ = auVar42._0_4_ + auVar42._0_4_;
              auVar75._4_4_ = auVar42._4_4_ + auVar42._4_4_;
              auVar75._8_4_ = auVar42._8_4_ + auVar42._8_4_;
              auVar75._12_4_ = auVar42._12_4_ + auVar42._12_4_;
              auVar78._0_4_ = auVar51._0_4_ * local_fd8[0];
              auVar78._4_4_ = auVar51._4_4_ * local_fd8[1];
              auVar78._8_4_ = auVar51._8_4_ * local_fd8[2];
              auVar78._12_4_ = auVar51._12_4_ * local_fd8[3];
              auVar42 = vfmadd213ps_fma(auVar50,local_fe8,auVar78);
              auVar42 = vfmadd213ps_fma(auVar41,local_ff8,auVar42);
              auVar41 = vrcp14ps_avx512vl(auVar75);
              auVar40 = auVar92._0_16_;
              auVar38 = vfnmadd213ps_avx512vl(auVar41,auVar75,auVar40);
              auVar41 = vfmadd132ps_fma(auVar38,auVar41,auVar41);
              local_1008._0_4_ = (auVar42._0_4_ + auVar42._0_4_) * auVar41._0_4_;
              local_1008._4_4_ = (auVar42._4_4_ + auVar42._4_4_) * auVar41._4_4_;
              local_1008._8_4_ = (auVar42._8_4_ + auVar42._8_4_) * auVar41._8_4_;
              local_1008._12_4_ = (auVar42._12_4_ + auVar42._12_4_) * auVar41._12_4_;
              auVar81 = ZEXT1664(local_1008);
              uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar17._4_4_ = uVar70;
              auVar17._0_4_ = uVar70;
              auVar17._8_4_ = uVar70;
              auVar17._12_4_ = uVar70;
              uVar9 = vcmpps_avx512vl(local_1008,auVar17,0xd);
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar41 = vxorps_avx512vl(auVar75,auVar18);
              fVar82 = (ray->super_RayK<1>).tfar;
              auVar19._4_4_ = fVar82;
              auVar19._0_4_ = fVar82;
              auVar19._8_4_ = fVar82;
              auVar19._12_4_ = fVar82;
              uVar10 = vcmpps_avx512vl(local_1008,auVar19,2);
              uVar11 = vcmpps_avx512vl(auVar75,auVar41,4);
              local_1030 = (byte)uVar9 & (byte)uVar10 & (byte)uVar11 & local_1030;
              uVar36 = (uint)local_1030;
              if (local_1030 != 0) {
                local_1190 = local_1190 + uVar30;
                auVar20._8_4_ = 0x219392ef;
                auVar20._0_8_ = 0x219392ef219392ef;
                auVar20._12_4_ = 0x219392ef;
                uVar28 = vcmpps_avx512vl(auVar39,auVar20,5);
                auVar41 = vrcp14ps_avx512vl(local_1048);
                auVar42 = vfnmadd213ps_avx512vl(local_1048,auVar41,auVar40);
                auVar41 = vfmadd132ps_avx512vl(auVar42,auVar41,auVar41);
                fVar82 = (float)((uint)((byte)uVar28 & 1) * auVar41._0_4_);
                fVar85 = (float)((uint)((byte)(uVar28 >> 1) & 1) * auVar41._4_4_);
                fVar86 = (float)((uint)((byte)(uVar28 >> 2) & 1) * auVar41._8_4_);
                fVar87 = (float)((uint)((byte)(uVar28 >> 3) & 1) * auVar41._12_4_);
                auVar67._0_4_ = fVar82 * local_1068._0_4_;
                auVar67._4_4_ = fVar85 * local_1068._4_4_;
                auVar67._8_4_ = fVar86 * local_1068._8_4_;
                auVar67._12_4_ = fVar87 * local_1068._12_4_;
                local_1028 = vminps_avx512vl(auVar67,auVar40);
                auVar68._0_4_ = fVar82 * local_1058._0_4_;
                auVar68._4_4_ = fVar85 * local_1058._4_4_;
                auVar68._8_4_ = fVar86 * local_1058._8_4_;
                auVar68._12_4_ = fVar87 * local_1058._12_4_;
                local_1018 = vminps_avx512vl(auVar68,auVar40);
                pSVar3 = context->scene;
                auVar41 = vblendmps_avx512vl(auVar37,local_1008);
                auVar64._0_4_ =
                     (uint)(local_1030 & 1) * auVar41._0_4_ |
                     (uint)!(bool)(local_1030 & 1) * local_1018._0_4_;
                bVar7 = (bool)(local_1030 >> 1 & 1);
                auVar64._4_4_ = (uint)bVar7 * auVar41._4_4_ | (uint)!bVar7 * local_1018._4_4_;
                bVar7 = (bool)(local_1030 >> 2 & 1);
                auVar64._8_4_ = (uint)bVar7 * auVar41._8_4_ | (uint)!bVar7 * local_1018._8_4_;
                auVar64._12_4_ =
                     (uint)(local_1030 >> 3) * auVar41._12_4_ |
                     (uint)!(bool)(local_1030 >> 3) * local_1018._12_4_;
                auVar41 = vshufps_avx(auVar64,auVar64,0xb1);
                auVar41 = vminps_avx(auVar41,auVar64);
                auVar42 = vshufpd_avx(auVar41,auVar41,1);
                auVar41 = vminps_avx(auVar42,auVar41);
                uVar9 = vcmpps_avx512vl(auVar64,auVar41,0);
                bVar23 = (byte)uVar9 & local_1030;
                if (((byte)uVar9 & local_1030) == 0) {
                  bVar23 = local_1030;
                }
                uVar28 = 0;
                for (uVar26 = (ulong)bVar23; (uVar26 & 1) == 0;
                    uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                  uVar28 = uVar28 + 1;
                }
                do {
                  uVar27 = *(uint *)(local_1190 + 0x120 + uVar28 * 4);
                  pGVar4 = (pSVar3->geometries).items[uVar27].ptr;
                  auVar41 = auVar64;
                  if ((pGVar4->mask & (ray->super_RayK<1>).mask) == 0) {
                    bVar23 = ~(byte)(1 << ((uint)uVar28 & 0x1f)) & (byte)uVar36;
LAB_01f490a7:
                    uVar36 = (uint)bVar23;
                    bVar7 = true;
                  }
                  else {
                    pRVar5 = context->args;
                    if ((pRVar5->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_1128.context = context->user;
                      local_10f8 = *(float *)(local_ff8 + uVar28 * 4);
                      local_10f4 = local_fd8[uVar28 - 4];
                      local_10f0 = local_fd8[uVar28];
                      local_10ec = *(undefined4 *)(local_1028 + uVar28 * 4);
                      local_10e8 = *(undefined4 *)(local_1018 + uVar28 * 4);
                      local_10e4 = *(undefined4 *)(local_1190 + 0x130 + uVar28 * 4);
                      local_10e0 = uVar27;
                      local_10dc = (local_1128.context)->instID[0];
                      local_10d8 = (local_1128.context)->instPrimID[0];
                      local_1188 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_1008 + uVar28 * 4);
                      local_1184 = -1;
                      local_1128.valid = &local_1184;
                      local_1128.geometryUserPtr = pGVar4->userPtr;
                      local_1128.ray = (RTCRayN *)ray;
                      local_1128.hit = (RTCHitN *)&local_10f8;
                      local_1128.N = 1;
                      local_1078 = auVar81._0_16_;
                      if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f49290:
                        if (pRVar5->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar4->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar5->filter)(&local_1128);
                            auVar81 = ZEXT1664(local_1078);
                            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                            auVar69 = ZEXT1664(auVar41);
                            auVar97 = ZEXT1664(local_10c8);
                            auVar96 = ZEXT1664(local_10b8);
                            auVar95 = ZEXT1664(local_10a8);
                            auVar94 = ZEXT1664(local_1098);
                            auVar93 = ZEXT1664(local_1088);
                            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar92 = ZEXT1664(auVar41);
                            context = local_1178;
                            ray = local_1180;
                            uVar31 = local_1198;
                            uVar32 = local_11a0;
                          }
                          if (*local_1128.valid == 0) goto LAB_01f4938f;
                        }
                        (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_1128.hit;
                        (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_1128.hit + 4);
                        (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_1128.hit + 8);
                        *(float *)((long)local_1128.ray + 0x3c) = *(float *)(local_1128.hit + 0xc);
                        local_1188 = *(float *)(local_1128.hit + 0x10);
                        *(float *)((long)local_1128.ray + 0x40) = local_1188;
                        *(float *)((long)local_1128.ray + 0x44) = *(float *)(local_1128.hit + 0x14);
                        *(float *)((long)local_1128.ray + 0x48) = *(float *)(local_1128.hit + 0x18);
                        *(float *)((long)local_1128.ray + 0x4c) = *(float *)(local_1128.hit + 0x1c);
                        *(float *)((long)local_1128.ray + 0x50) = *(float *)(local_1128.hit + 0x20);
                      }
                      else {
                        local_1170 = uVar30;
                        local_1168 = pauVar33;
                        (*pGVar4->intersectionFilterN)(&local_1128);
                        auVar81 = ZEXT1664(local_1078);
                        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        auVar69 = ZEXT1664(auVar41);
                        auVar97 = ZEXT1664(local_10c8);
                        auVar96 = ZEXT1664(local_10b8);
                        auVar95 = ZEXT1664(local_10a8);
                        auVar94 = ZEXT1664(local_1098);
                        auVar93 = ZEXT1664(local_1088);
                        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar92 = ZEXT1664(auVar41);
                        context = local_1178;
                        ray = local_1180;
                        uVar30 = local_1170;
                        uVar31 = local_1198;
                        uVar32 = local_11a0;
                        pauVar33 = local_1168;
                        if (*local_1128.valid != 0) goto LAB_01f49290;
LAB_01f4938f:
                        (ray->super_RayK<1>).tfar = local_1188;
                      }
                      fVar82 = (ray->super_RayK<1>).tfar;
                      auVar21._4_4_ = fVar82;
                      auVar21._0_4_ = fVar82;
                      auVar21._8_4_ = fVar82;
                      auVar21._12_4_ = fVar82;
                      uVar9 = vcmpps_avx512vl(auVar81._0_16_,auVar21,2);
                      bVar23 = ~(byte)(1 << ((uint)uVar28 & 0x1f)) & (byte)uVar36 & (byte)uVar9;
                      auVar41 = ZEXT416((uint)local_1188);
                      goto LAB_01f490a7;
                    }
                    bVar7 = false;
                  }
                  if (!bVar7) {
                    fVar82 = *(float *)(local_1028 + uVar28 * 4);
                    fVar85 = *(float *)(local_1018 + uVar28 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1008 + uVar28 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_ff8 + uVar28 * 4);
                    (ray->Ng).field_0.field_0.y = local_fd8[uVar28 - 4];
                    (ray->Ng).field_0.field_0.z = local_fd8[uVar28];
                    ray->u = fVar82;
                    ray->v = fVar85;
                    ray->primID = *(uint *)(local_1190 + 0x130 + uVar28 * 4);
                    ray->geomID = uVar27;
                    pRVar6 = context->user;
                    ray->instID[0] = pRVar6->instID[0];
                    ray->instPrimID[0] = pRVar6->instPrimID[0];
                    break;
                  }
                  bVar23 = (byte)uVar36;
                  if (bVar23 == 0) break;
                  auVar42 = vblendmps_avx512vl(auVar69._0_16_,auVar81._0_16_);
                  auVar64._0_4_ =
                       (uint)(bVar23 & 1) * auVar42._0_4_ |
                       (uint)!(bool)(bVar23 & 1) * auVar41._0_4_;
                  bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
                  auVar64._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar41._4_4_;
                  bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
                  auVar64._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar41._8_4_;
                  auVar64._12_4_ =
                       (uVar36 >> 3) * auVar42._12_4_ | (uint)!SUB41(uVar36 >> 3,0) * auVar41._12_4_
                  ;
                  auVar41 = vshufps_avx(auVar64,auVar64,0xb1);
                  auVar41 = vminps_avx(auVar41,auVar64);
                  auVar42 = vshufpd_avx(auVar41,auVar41,1);
                  auVar41 = vminps_avx(auVar42,auVar41);
                  uVar9 = vcmpps_avx512vl(auVar64,auVar41,0);
                  bVar23 = (byte)uVar9 & bVar23;
                  uVar27 = uVar36;
                  if (bVar23 != 0) {
                    uVar27 = (uint)bVar23;
                  }
                  uVar12 = 0;
                  for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
                    uVar12 = uVar12 + 1;
                  }
                  uVar28 = (ulong)uVar12;
                } while( true );
              }
            }
            local_1130 = local_1130 + 1;
          } while (local_1130 != local_1138);
        }
        fVar82 = (ray->super_RayK<1>).tfar;
        auVar69 = ZEXT1664(CONCAT412(fVar82,CONCAT48(fVar82,CONCAT44(fVar82,fVar82))));
        auVar81 = ZEXT1664(local_f88);
        auVar88 = ZEXT1664(local_fa8);
        auVar89 = ZEXT1664(local_fb8);
        auVar90 = ZEXT1664(local_fc8);
        uVar28 = local_1148;
        unaff_RBP = local_1140;
        uVar26 = local_1160;
        uVar34 = local_1150;
        uVar35 = local_1158;
        fVar82 = local_f98;
        fVar85 = fStack_f94;
        fVar86 = fStack_f90;
        fVar87 = fStack_f8c;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }